

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorTiledBox::GenerateElementData
          (DecoratorTiledBox *this,Element *element,BoxArea paint_area)

{
  undefined1 *puVar1;
  undefined1 *this_00;
  undefined1 *this_01;
  undefined1 *this_02;
  undefined1 *this_03;
  undefined1 *this_04;
  undefined1 *this_05;
  undefined1 *this_06;
  Tile *this_07;
  bool bVar2;
  code *pcVar3;
  Vector2f surface_origin;
  Vector2f VVar4;
  Vector2f VVar5;
  Vector2f VVar6;
  Vector2f VVar7;
  Vector2f VVar8;
  Vector2f VVar9;
  Vector2f VVar10;
  Vector2f surface_dimensions;
  Vector2f surface_dimensions_00;
  Vector2f surface_dimensions_01;
  Vector2f surface_dimensions_02;
  Vector2f surface_dimensions_03;
  Vector2f tile_dimensions;
  Vector2f surface_dimensions_04;
  Vector2f surface_dimensions_05;
  Vector2f tile_dimensions_00;
  Vector2f tile_dimensions_01;
  float fVar11;
  float fVar12;
  bool bVar13;
  uint num_textures;
  ComputedValues *computed;
  DecoratorTiledBoxData *this_08;
  RenderManager *mesh_00;
  long lVar14;
  ulong uVar15;
  int index;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float minimum_height;
  float fVar23;
  Texture texture;
  float local_328;
  float fStack_324;
  Vector2f local_318;
  Vector2f local_308;
  float local_2f8;
  float local_2e8;
  float fStack_2e4;
  float local_2b8;
  float fStack_2b4;
  Vector2f local_2a8;
  float local_298;
  float fStack_294;
  Vector2f local_288;
  float local_278;
  float fStack_274;
  undefined1 local_228 [16];
  Mesh mesh [9];
  RenderBox render_box;
  
  puVar1 = &this->field_0x30;
  lVar14 = 0x30;
  do {
    if (lVar14 == 0x2dc) {
      Element::GetRenderBox(&render_box,element,paint_area,0);
      VVar4 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)puVar1,element);
      this_01 = &this->field_0x1f8;
      VVar5 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_01,element);
      this_00 = &this->field_0x7c;
      VVar6 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_00,element);
      this_02 = &this->field_0xc8;
      VVar7 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_02,element);
      this_03 = &this->field_0x244;
      VVar8 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_03,element);
      this_04 = &this->field_0x114;
      VVar9 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_04,element);
      this_05 = &this->field_0x160;
      VVar10 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_05,element);
      this_06 = &this->field_0x1ac;
      local_308 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_06,element);
      fVar17 = local_308.x;
      local_2b8 = VVar6.x;
      fStack_2b4 = VVar6.y;
      local_278 = VVar4.x;
      fStack_274 = VVar4.y;
      local_2e8 = render_box.fill_size.x;
      fStack_2e4 = render_box.fill_size.y;
      fVar19 = local_278 + local_2b8;
      local_288.x = VVar10.x;
      local_288.y = VVar10.y;
      fVar12 = local_288.y;
      local_298 = VVar7.x;
      fStack_294 = VVar7.y;
      local_318.x = VVar9.x;
      local_318.y = VVar9.y;
      fVar11 = local_318.y;
      local_2a8.x = VVar5.x;
      fVar22 = local_2a8.x;
      local_2a8.y = VVar5.y;
      fVar18 = local_2a8.y;
      if (fVar19 <= local_2e8) {
        local_2f8 = local_288.x;
      }
      else {
        bVar13 = NAN(local_278);
        bVar2 = local_278 == local_288.x;
        local_278 = (local_278 / fVar19) * local_2e8;
        local_2f8 = local_288.x;
        if ((bVar2) && (!bVar13 && !NAN(local_288.x))) {
          local_2f8 = local_278;
        }
        bVar13 = NAN(local_2b8);
        bVar2 = local_2b8 == fVar17;
        local_2b8 = (local_2b8 / fVar19) * local_2e8;
        if ((bVar2) && (!bVar13 && !NAN(fVar17))) {
          local_308.y = local_308.y;
          local_308.x = local_2b8;
        }
      }
      fVar20 = local_298 + local_318.x;
      fVar19 = local_318.x;
      if (local_2e8 < fVar20) {
        bVar13 = NAN(local_298);
        bVar2 = local_298 == local_288.x;
        local_298 = (local_298 / fVar20) * local_2e8;
        if ((bVar2) && (!bVar13 && !NAN(local_288.x))) {
          local_2f8 = local_298;
        }
        fVar19 = (local_318.x / fVar20) * local_2e8;
        if ((local_318.x == fVar17) && (!NAN(local_318.x) && !NAN(fVar17))) {
          local_308.x = fVar19;
        }
      }
      fVar23 = fStack_274 + fStack_294;
      local_328 = VVar8.x;
      fStack_324 = VVar8.y;
      fVar17 = fStack_324;
      fVar20 = local_2a8.y;
      if (fStack_2e4 < fVar23) {
        fVar20 = (fStack_274 / fVar23) * fStack_2e4;
        bVar13 = fStack_274 == local_2a8.y;
        fVar17 = (fStack_294 / fVar23) * fStack_2e4;
        bVar2 = fStack_294 == fStack_324;
        fStack_294 = fVar17;
        fStack_274 = fVar20;
        fVar17 = (float)(~-(uint)bVar2 & (uint)fStack_324 | (uint)fVar17 & -(uint)bVar2);
        fVar20 = (float)(~-(uint)bVar13 & (uint)local_2a8.y | (uint)fVar20 & -(uint)bVar13);
      }
      local_318.y = fStack_274;
      local_318.x = local_278;
      local_2a8.y = fStack_294;
      local_2a8.x = local_298;
      fVar23 = fStack_2b4 + fVar11;
      local_288.y = render_box.border_widths._M_elems[0];
      local_288.x = render_box.border_widths._M_elems[3];
      if (fStack_2e4 < fVar23) {
        fVar21 = (fStack_2b4 / fVar23) * fStack_2e4;
        fVar20 = (float)(~-(uint)(fStack_2b4 == fVar18) & (uint)fVar20 |
                        (uint)fVar21 & -(uint)(fStack_2b4 == fVar18));
        fVar18 = (fVar11 / fVar23) * fStack_2e4;
        fVar17 = (float)(~-(uint)(fVar11 == fStack_324) & (uint)fVar17 |
                        (uint)fVar18 & -(uint)(fVar11 == fStack_324));
        fVar11 = fVar18;
        fStack_2b4 = fVar21;
      }
      surface_dimensions_04.y = fStack_2b4;
      surface_dimensions_04.x = local_2b8;
      tile_dimensions_01.y = fVar20;
      tile_dimensions_01.x = fVar22;
      tile_dimensions_00.y = fVar17;
      tile_dimensions_00.x = local_328;
      surface_dimensions_05.y = fVar11;
      surface_dimensions_05.x = fVar19;
      computed = Element::GetComputedValues(element);
      memset(mesh,0,0x1b0);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)puVar1,mesh + *(int *)puVar1,computed,local_288,local_318,local_318);
      VVar4.y = render_box.border_widths._M_elems[0] + 0.0;
      VVar4.x = render_box.border_widths._M_elems[3] + local_278;
      surface_dimensions.y = fVar20;
      surface_dimensions.x = local_2e8 - (local_278 + local_2b8);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_01,mesh + *(int *)this_01,computed,VVar4,surface_dimensions,
                 tile_dimensions_01);
      VVar5.y = render_box.border_widths._M_elems[0] + 0.0;
      VVar5.x = (local_2e8 - local_2b8) + render_box.border_widths._M_elems[3];
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_00,mesh + *(int *)this_00,computed,VVar5,surface_dimensions_04,
                 surface_dimensions_04);
      tile_dimensions.y = fVar12;
      tile_dimensions.x = local_2f8;
      surface_origin.y = render_box.border_widths._M_elems[0] + fStack_274;
      surface_origin.x = render_box.border_widths._M_elems[3] + 0.0;
      surface_dimensions_03.y = fStack_2e4 - (fStack_274 + fStack_294);
      surface_dimensions_03.x = local_2f8;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_05,mesh + *(int *)this_05,computed,surface_origin,
                 surface_dimensions_03,tile_dimensions);
      fVar22 = local_308.x;
      VVar10.y = fStack_2b4 + render_box.border_widths._M_elems[0];
      VVar10.x = (local_2e8 - fVar22) + render_box.border_widths._M_elems[3];
      surface_dimensions_02.y = fStack_2e4 - (fVar11 + fStack_2b4);
      surface_dimensions_02.x = fVar22;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_06,mesh + *(int *)this_06,computed,VVar10,surface_dimensions_02,
                 local_308);
      VVar9.y = (fStack_2e4 - fStack_294) + render_box.border_widths._M_elems[0];
      VVar9.x = render_box.border_widths._M_elems[3] + 0.0;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_02,mesh + *(int *)this_02,computed,VVar9,local_2a8,local_2a8);
      VVar8.y = (fStack_2e4 - fVar17) + render_box.border_widths._M_elems[0];
      VVar8.x = render_box.border_widths._M_elems[3] + local_298;
      surface_dimensions_01.y = fVar17;
      surface_dimensions_01.x = local_2e8 - (local_298 + fVar19);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_03,mesh + *(int *)this_03,computed,VVar8,surface_dimensions_01,
                 tile_dimensions_00);
      VVar6.y = render_box.border_widths._M_elems[0] + (fStack_2e4 - fVar11);
      VVar6.x = render_box.border_widths._M_elems[3] + (local_2e8 - fVar19);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_04,mesh + *(int *)this_04,computed,VVar6,surface_dimensions_05,
                 surface_dimensions_05);
      puVar1 = &this->field_0x290;
      VVar4 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)puVar1,element);
      VVar7.y = render_box.border_widths._M_elems[0] + fVar20;
      VVar7.x = render_box.border_widths._M_elems[3] + local_2f8;
      surface_dimensions_00.y = fStack_2e4 - (fVar20 + fVar17);
      surface_dimensions_00.x = local_2e8 - (local_2f8 + fVar22);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)puVar1,mesh + *(int *)puVar1,computed,VVar7,surface_dimensions_00,VVar4);
      num_textures = Decorator::GetNumTextures((Decorator *)this);
      this_08 = (DecoratorTiledBoxData *)operator_new(0x10);
      DecoratorTiledBoxData::DecoratorTiledBoxData(this_08,num_textures);
      mesh_00 = Element::GetRenderManager(element);
      uVar15 = 0;
      uVar16 = (ulong)num_textures;
      if ((int)num_textures < 1) {
        uVar16 = uVar15;
      }
      for (; uVar16 * 0x10 != uVar15; uVar15 = uVar15 + 0x10) {
        RenderManager::MakeGeometry((RenderManager *)local_228,(Mesh *)mesh_00);
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                     *)((long)&(this_08->geometry->
                               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                               ).render_manager + uVar15),
                    (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                     *)local_228);
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::~UniqueRenderResource
                  ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)local_228);
      }
      lVar14 = 0x180;
      do {
        Mesh::~Mesh((Mesh *)((long)&mesh[0].vertices.
                                    super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar14));
        lVar14 = lVar14 + -0x30;
      } while (lVar14 != -0x30);
      return (DecoratorDataHandle)this_08;
    }
    this_07 = (Tile *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar14)
    ;
    index = *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar14);
    if (index < 0) {
      bVar13 = Assert("RMLUI_ASSERT(tiles[i].texture_index >= 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiledBox.cpp"
                      ,0x68);
      if (!bVar13) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      index = this_07->texture_index;
    }
    texture = Decorator::GetTexture((Decorator *)this,index);
    DecoratorTiled::Tile::CalculateDimensions(this_07,texture);
    lVar14 = lVar14 + 0x4c;
  } while( true );
}

Assistant:

DecoratorDataHandle DecoratorTiledBox::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tiles for this element.
	for (int i = 0; i < 9; i++)
	{
		RMLUI_ASSERT(tiles[i].texture_index >= 0);
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));
	}

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	// Calculate the natural dimensions of tile corners and edges.
	const Vector2f natural_top_left = tiles[TOP_LEFT_CORNER].GetNaturalDimensions(element);
	const Vector2f natural_top = tiles[TOP_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_top_right = tiles[TOP_RIGHT_CORNER].GetNaturalDimensions(element);

	const Vector2f natural_bottom_left = tiles[BOTTOM_LEFT_CORNER].GetNaturalDimensions(element);
	const Vector2f natural_bottom = tiles[BOTTOM_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_bottom_right = tiles[BOTTOM_RIGHT_CORNER].GetNaturalDimensions(element);

	const Vector2f natural_left = tiles[LEFT_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_right = tiles[RIGHT_EDGE].GetNaturalDimensions(element);

	// Initialize the to-be-determined dimensions of the tiles.
	Vector2f top_left = natural_top_left;
	Vector2f top = natural_top;
	Vector2f top_right = natural_top_right;

	Vector2f bottom_left = natural_bottom_left;
	Vector2f bottom = natural_bottom;
	Vector2f bottom_right = natural_bottom_right;

	Vector2f left = natural_left;
	Vector2f right = natural_right;

	// Scale the top corners down if appropriate. If they are scaled, then the left and right edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.x < top_left.x + top_right.x)
	{
		float minimum_width = top_left.x + top_right.x;

		top_left.x = size.x * (top_left.x / minimum_width);
		if (natural_top_left.x == natural_left.x)
			left.x = top_left.x;

		top_right.x = size.x * (top_right.x / minimum_width);
		if (natural_top_right.x == natural_right.x)
			right.x = top_right.x;
	}

	// Scale the bottom corners down if appropriate. If they are scaled, then the left and right edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.x < bottom_left.x + bottom_right.x)
	{
		float minimum_width = bottom_left.x + bottom_right.x;

		bottom_left.x = size.x * (bottom_left.x / minimum_width);
		if (natural_bottom_left.x == natural_left.x)
			left.x = bottom_left.x;

		bottom_right.x = size.x * (bottom_right.x / minimum_width);
		if (natural_bottom_right.x == natural_right.x)
			right.x = bottom_right.x;
	}

	// Scale the left corners down if appropriate. If they are scaled, then the top and bottom edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.y < top_left.y + bottom_left.y)
	{
		float minimum_height = top_left.y + bottom_left.y;

		top_left.y = size.y * (top_left.y / minimum_height);
		if (natural_top_left.y == natural_top.y)
			top.y = top_left.y;

		bottom_left.y = size.y * (bottom_left.y / minimum_height);
		if (natural_bottom_left.y == natural_bottom.y)
			bottom.y = bottom_left.y;
	}

	// Scale the right corners down if appropriate. If they are scaled, then the top and bottom edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.y < top_right.y + bottom_right.y)
	{
		float minimum_height = top_right.y + bottom_right.y;

		top_right.y = size.y * (top_right.y / minimum_height);
		if (natural_top_right.y == natural_top.y)
			top.y = top_right.y;

		bottom_right.y = size.y * (bottom_right.y / minimum_height);
		if (natural_bottom_right.y == natural_bottom.y)
			bottom.y = bottom_right.y;
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	// Generate the geometry for the top-left tile.
	tiles[TOP_LEFT_CORNER].GenerateGeometry(mesh[tiles[TOP_LEFT_CORNER].texture_index], computed, offset, top_left, top_left);
	// Generate the geometry for the top edge tiles.
	tiles[TOP_EDGE].GenerateGeometry(mesh[tiles[TOP_EDGE].texture_index], computed, offset + Vector2f(top_left.x, 0),
		Vector2f(size.x - (top_left.x + top_right.x), top.y), top);
	// Generate the geometry for the top-right tile.
	tiles[TOP_RIGHT_CORNER].GenerateGeometry(mesh[tiles[TOP_RIGHT_CORNER].texture_index], computed, offset + Vector2f(size.x - top_right.x, 0),
		top_right, top_right);

	// Generate the geometry for the left side.
	tiles[LEFT_EDGE].GenerateGeometry(mesh[tiles[LEFT_EDGE].texture_index], computed, offset + Vector2f(0, top_left.y),
		Vector2f(left.x, size.y - (top_left.y + bottom_left.y)), left);

	// Generate the geometry for the right side.
	tiles[RIGHT_EDGE].GenerateGeometry(mesh[tiles[RIGHT_EDGE].texture_index], computed, offset + Vector2f((size.x - right.x), top_right.y),
		Vector2f(right.x, size.y - (top_right.y + bottom_right.y)), right);

	// Generate the geometry for the bottom-left tile.
	tiles[BOTTOM_LEFT_CORNER].GenerateGeometry(mesh[tiles[BOTTOM_LEFT_CORNER].texture_index], computed, offset + Vector2f(0, size.y - bottom_left.y),
		bottom_left, bottom_left);
	// Generate the geometry for the bottom edge tiles.
	tiles[BOTTOM_EDGE].GenerateGeometry(mesh[tiles[BOTTOM_EDGE].texture_index], computed, offset + Vector2f(bottom_left.x, size.y - bottom.y),
		Vector2f(size.x - (bottom_left.x + bottom_right.x), bottom.y), bottom);
	// Generate the geometry for the bottom-right tile.
	tiles[BOTTOM_RIGHT_CORNER].GenerateGeometry(mesh[tiles[BOTTOM_RIGHT_CORNER].texture_index], computed,
		offset + Vector2f(size.x - bottom_right.x, size.y - bottom_right.y), bottom_right, bottom_right);

	// Generate the centre geometry.
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);
	Vector2f centre_surface_dimensions(size.x - (left.x + right.x), size.y - (top.y + bottom.y));

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(left.x, top.y), centre_surface_dimensions,
		centre_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledBoxData* data = new DecoratorTiledBoxData(num_textures);
	RenderManager* render_manager = element->GetRenderManager();

	// Set the mesh and textures on the geometry.
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}